

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O2

int __thiscall
QItemSelectionModel::select
          (QItemSelectionModel *this,int __nfds,fd_set *__readfds,fd_set *__writefds,
          fd_set *__exceptfds,timeval *__timeout)

{
  QItemSelection *this_00;
  QItemSelectionModelPrivate *this_01;
  int *piVar1;
  parameter_type pQVar2;
  QFlagsStorage<QItemSelectionModel::SelectionFlag> command;
  undefined4 in_register_00000034;
  undefined8 *puVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<QItemSelectionRange> local_88;
  QArrayDataPointer<QItemSelectionRange> local_70;
  QMessageLogger local_58;
  long local_38;
  
  puVar3 = (undefined8 *)CONCAT44(in_register_00000034,__nfds);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QItemSelectionModelPrivate **)(this + 8);
  pQVar2 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
           ::value(&this_01->model);
  if (pQVar2 == (parameter_type)0x0) {
    local_58.context.version = 2;
    local_58.context.function._4_4_ = 0;
    local_58.context.line = 0;
    local_58.context.file._0_4_ = 0;
    local_58.context.file._4_4_ = 0;
    local_58.context.function._0_4_ = 0;
    local_58.context.category = "default";
    QMessageLogger::warning
              (&local_58,
               "QItemSelectionModel: Selecting when no model has been set will result in a no-op.");
  }
  else {
    command.i = (Int)__readfds;
    if ((QFlagsStorage<QItemSelectionModel::SelectionFlag>)command.i !=
        (QFlagsStorage<QItemSelectionModel::SelectionFlag>)0x0) {
      piVar1 = (int *)*puVar3;
      local_58.context.version = (int)piVar1;
      local_58.context.line = (int)((ulong)piVar1 >> 0x20);
      local_58.context.file._0_4_ = (undefined4)puVar3[1];
      local_58.context.file._4_4_ = (undefined4)((ulong)puVar3[1] >> 0x20);
      local_58.context.function._0_4_ = (undefined4)puVar3[2];
      local_58.context.function._4_4_ = (undefined4)((ulong)puVar3[2] >> 0x20);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      QList<QItemSelectionRange>::removeIf<(anonymous_namespace)::QtFunctionObjects::IsNotValid>
                (&(this_01->ranges).super_QList<QItemSelectionRange>);
      local_70.d = (this_01->ranges).super_QList<QItemSelectionRange>.d.d;
      local_70.ptr = (this_01->ranges).super_QList<QItemSelectionRange>.d.ptr;
      local_70.size = (this_01->ranges).super_QList<QItemSelectionRange>.d.size;
      if (local_70.d != (Data *)0x0) {
        LOCK();
        ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      this_00 = &this_01->currentSelection;
      QItemSelection::merge
                ((QItemSelection *)&local_70,this_00,
                 (SelectionFlags)
                 (this_01->currentCommand).
                 super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
                 super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i);
      if (((ulong)__readfds & 0x60) != 0) {
        QItemSelectionModelPrivate::expandSelection
                  ((QItemSelection *)&local_88,this_01,(QItemSelection *)&local_58,
                   (SelectionFlags)command.i);
        QArrayDataPointer<QItemSelectionRange>::operator=
                  ((QArrayDataPointer<QItemSelectionRange> *)&local_58,&local_88);
        QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_88);
      }
      if (((ulong)__readfds & 1) != 0) {
        QList<QItemSelectionRange>::clear(&(this_01->ranges).super_QList<QItemSelectionRange>);
        QList<QItemSelectionRange>::clear(&this_00->super_QList<QItemSelectionRange>);
      }
      if (((ulong)__readfds & 0x10) == 0) {
        QItemSelectionModelPrivate::finalize(this_01);
      }
      if (((ulong)__readfds & 0xe) != 0) {
        (this_01->currentCommand).super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
        super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i = command.i;
        QArrayDataPointer<QItemSelectionRange>::operator=
                  ((QArrayDataPointer<QItemSelectionRange> *)this_00,
                   (QArrayDataPointer<QItemSelectionRange> *)&local_58);
      }
      local_88.d = (this_01->ranges).super_QList<QItemSelectionRange>.d.d;
      local_88.ptr = (this_01->ranges).super_QList<QItemSelectionRange>.d.ptr;
      local_88.size = (this_01->ranges).super_QList<QItemSelectionRange>.d.size;
      if (local_88.d != (Data *)0x0) {
        LOCK();
        ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QItemSelection::merge
                ((QItemSelection *)&local_88,this_00,
                 (SelectionFlags)
                 (this_01->currentCommand).
                 super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
                 super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i);
      emitSelectionChanged(this,(QItemSelection *)&local_88,(QItemSelection *)&local_70);
      QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_88);
      QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_70);
      QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer
                ((QArrayDataPointer<QItemSelectionRange> *)&local_58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QItemSelectionModel::select(const QItemSelection &selection, QItemSelectionModel::SelectionFlags command)
{
    Q_D(QItemSelectionModel);
    if (!d->model.value()) {
        qWarning("QItemSelectionModel: Selecting when no model has been set will result in a no-op.");
        return;
    }
    if (command == NoUpdate)
        return;

    // store old selection
    QItemSelection sel = selection;
    // If d->ranges is non-empty when the source model is reset the persistent indexes
    // it contains will be invalid. We can't clear them in a modelReset slot because that might already
    // be too late if another model observer is connected to the same modelReset slot and is invoked first
    // it might call select() on this selection model before any such QItemSelectionModelPrivate::modelReset() slot
    // is invoked, so it would not be cleared yet. We clear it invalid ranges in it here.
    d->ranges.removeIf(QtFunctionObjects::IsNotValid());

    QItemSelection old = d->ranges;
    old.merge(d->currentSelection, d->currentCommand);

    // expand selection according to SelectionBehavior
    if (command & Rows || command & Columns)
        sel = d->expandSelection(sel, command);

    // clear ranges and currentSelection
    if (command & Clear) {
        d->ranges.clear();
        d->currentSelection.clear();
    }

    // merge and clear currentSelection if Current was not set (ie. start new currentSelection)
    if (!(command & Current))
        d->finalize();

    // update currentSelection
    if (command & Toggle || command & Select || command & Deselect) {
        d->currentCommand = command;
        d->currentSelection = sel;
    }

    // generate new selection, compare with old and emit selectionChanged()
    QItemSelection newSelection = d->ranges;
    newSelection.merge(d->currentSelection, d->currentCommand);
    emitSelectionChanged(newSelection, old);
}